

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream_any_tests.cpp
# Opt level: O0

void character(void)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1e0 [32];
  Assert local_1c0 [2];
  outputter<char> local_1a0;
  stringstream local_198 [8];
  stringstream ss;
  ostream local_188 [383];
  char local_9 [8];
  char i;
  
  local_9[0] = 'c';
  std::__cxx11::stringstream::stringstream(local_198);
  local_1a0 = UnitTests::stream_any<char>(local_9);
  UnitTests::stream_any_details::operator<<(local_188,&local_1a0);
  UnitTests::Assert::Assert
            (local_1c0,
             "/workspace/llm4binary/github/license_all_cmakelists_25/john-mullins[P]TestFramework/tests/stream_any_tests.cpp"
             ,0x2b);
  std::__cxx11::stringstream::str();
  UnitTests::Assert::Equals<char[2],std::__cxx11::string>
            (local_1c0,(char (*) [2])0x12b6a8,local_1e0);
  std::__cxx11::string::~string((string *)local_1e0);
  std::__cxx11::stringstream::~stringstream(local_198);
  return;
}

Assistant:

TEST(character)
{
    auto i  = 'c';
    auto ss = std::stringstream{};
    ss << UnitTests::stream_any(i);
    ASSERT_EQUALS("c", ss.str());
}